

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

Error asmjit::v1_14::Formatter::formatData
                (String *sb,FormatFlags formatFlags,Arch arch,TypeId typeId,void *data,
                size_t itemCount,size_t repeatCount)

{
  Error EVar1;
  byte in_CL;
  byte in_DL;
  uint32_t in_ESI;
  String *in_RDI;
  uint8_t *in_R8;
  size_t in_R9;
  ulong in_stack_00000008;
  Error _err;
  char *wordName;
  uint32_t typeSizeLog2;
  uint32_t typeSize;
  uint local_7c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined3 in_stack_ffffffffffffffac;
  undefined4 uVar2;
  uint local_48;
  uint local_44 [2];
  int local_3c;
  undefined1 *local_38;
  uint local_2c;
  undefined1 *local_28;
  char *local_20;
  uint *local_10;
  uint *local_8;
  
  if (in_DL < 0x11) {
    uVar2 = CONCAT13(in_CL,in_stack_ffffffffffffffac);
    local_2c = (uint)(byte)TypeUtils::_typeData[(ulong)in_CL + 0x100];
    if (local_2c == 0) {
      EVar1 = DebugUtils::errored(3);
    }
    else {
      local_7c = local_2c;
      if (local_2c == 0 || (local_2c & local_2c - 1) != 0) {
        in_R9 = local_2c * in_R9;
        local_7c = 1;
      }
      for (; 8 < local_7c; local_7c = local_7c >> 1) {
        in_R9 = in_R9 << 1;
      }
      local_44[0] = local_7c;
      local_10 = local_44;
      local_48 = local_7c;
      local_8 = &local_48;
      local_3c = 0;
      for (; (local_7c & 1) == 0; local_7c = local_7c >> 1 | 0x80000000) {
        local_3c = local_3c + 1;
      }
      local_38 = _archTraits + (ulong)in_DL * 0xd8;
      if (1 < in_stack_00000008) {
        local_20 = ".repeat %zu ";
        local_28 = (undefined1 *)&stack0x00000008;
        EVar1 = String::_opFormat(in_RDI,kAppend,".repeat %zu ",in_stack_00000008);
        if (EVar1 != 0) {
          return EVar1;
        }
      }
      EVar1 = formatDataHelper((String *)CONCAT44(uVar2,in_stack_ffffffffffffffa8),(char *)in_RDI,
                               in_ESI,in_R8,in_R9);
    }
  }
  else {
    EVar1 = DebugUtils::errored(4);
  }
  return EVar1;
}

Assistant:

Error formatData(
  String& sb,
  FormatFlags formatFlags,
  Arch arch,
  TypeId typeId, const void* data, size_t itemCount, size_t repeatCount) noexcept
{
  DebugUtils::unused(formatFlags);

  if (ASMJIT_UNLIKELY(!Environment::isDefinedArch(arch)))
    return DebugUtils::errored(kErrorInvalidArch);

  uint32_t typeSize = TypeUtils::sizeOf(typeId);
  if (typeSize == 0)
    return DebugUtils::errored(kErrorInvalidState);

  if (!Support::isPowerOf2(typeSize)) {
    itemCount *= typeSize;
    typeSize = 1;
  }

  while (typeSize > 8u) {
    typeSize >>= 1;
    itemCount <<= 1;
  }

  uint32_t typeSizeLog2 = Support::ctz(typeSize);
  const char* wordName = wordNameTable[size_t(ArchTraits::byArch(arch).typeNameIdByIndex(typeSizeLog2))];

  if (repeatCount > 1)
    ASMJIT_PROPAGATE(sb.appendFormat(".repeat %zu ", repeatCount));

  return formatDataHelper(sb, wordName, typeSize, static_cast<const uint8_t*>(data), itemCount);
}